

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int geopolyBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  sqlite3_index_constraint *psVar1;
  sqlite3_index_constraint *p;
  int idxNum;
  int iFuncTerm;
  int iRowidTerm;
  int ii;
  sqlite3_index_info *pIdxInfo_local;
  sqlite3_vtab *tab_local;
  
  iRowidTerm = -1;
  iFuncTerm = -1;
  idxNum = 0;
  ii = 0;
  do {
    if (pIdxInfo->nConstraint <= ii) {
LAB_002a2e69:
      if (iRowidTerm < 0) {
        if (iFuncTerm < 0) {
          pIdxInfo->idxNum = 4;
          pIdxInfo->idxStr = "fullscan";
          pIdxInfo->estimatedCost = 3000000.0;
          pIdxInfo->estimatedRows = 100000;
        }
        else {
          pIdxInfo->idxNum = idxNum;
          pIdxInfo->idxStr = "rtree";
          pIdxInfo->aConstraintUsage[iFuncTerm].argvIndex = 1;
          pIdxInfo->aConstraintUsage[iFuncTerm].omit = '\0';
          pIdxInfo->estimatedCost = 300.0;
          pIdxInfo->estimatedRows = 10;
        }
      }
      else {
        pIdxInfo->idxNum = 1;
        pIdxInfo->idxStr = "rowid";
        pIdxInfo->aConstraintUsage[iRowidTerm].argvIndex = 1;
        pIdxInfo->aConstraintUsage[iRowidTerm].omit = '\x01';
        pIdxInfo->estimatedCost = 30.0;
        pIdxInfo->estimatedRows = 1;
        pIdxInfo->idxFlags = 1;
      }
      return 0;
    }
    psVar1 = pIdxInfo->aConstraint + ii;
    if (psVar1->usable != '\0') {
      if ((psVar1->iColumn < 0) && (psVar1->op == '\x02')) {
        iRowidTerm = ii;
        goto LAB_002a2e69;
      }
      if ((psVar1->iColumn == 0) && (0x95 < psVar1->op)) {
        iFuncTerm = ii;
        idxNum = psVar1->op - 0x94;
      }
    }
    ii = ii + 1;
  } while( true );
}

Assistant:

static int geopolyBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  int ii;
  int iRowidTerm = -1;
  int iFuncTerm = -1;
  int idxNum = 0;
  (void)tab;

  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];
    if( !p->usable ) continue;
    if( p->iColumn<0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ  ){
      iRowidTerm = ii;
      break;
    }
    if( p->iColumn==0 && p->op>=SQLITE_INDEX_CONSTRAINT_FUNCTION ){
      /* p->op==SQLITE_INDEX_CONSTRAINT_FUNCTION for geopoly_overlap()
      ** p->op==(SQLITE_INDEX_CONTRAINT_FUNCTION+1) for geopoly_within().
      ** See geopolyFindFunction() */
      iFuncTerm = ii;
      idxNum = p->op - SQLITE_INDEX_CONSTRAINT_FUNCTION + 2;
    }
  }

  if( iRowidTerm>=0 ){
    pIdxInfo->idxNum = 1;
    pIdxInfo->idxStr = "rowid";
    pIdxInfo->aConstraintUsage[iRowidTerm].argvIndex = 1;
    pIdxInfo->aConstraintUsage[iRowidTerm].omit = 1;
    pIdxInfo->estimatedCost = 30.0;
    pIdxInfo->estimatedRows = 1;
    pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
    return SQLITE_OK;
  }
  if( iFuncTerm>=0 ){
    pIdxInfo->idxNum = idxNum;
    pIdxInfo->idxStr = "rtree";
    pIdxInfo->aConstraintUsage[iFuncTerm].argvIndex = 1;
    pIdxInfo->aConstraintUsage[iFuncTerm].omit = 0;
    pIdxInfo->estimatedCost = 300.0;
    pIdxInfo->estimatedRows = 10;
    return SQLITE_OK;
  }
  pIdxInfo->idxNum = 4;
  pIdxInfo->idxStr = "fullscan";
  pIdxInfo->estimatedCost = 3000000.0;
  pIdxInfo->estimatedRows = 100000;
  return SQLITE_OK;
}